

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFGGrindReader.cpp
# Opt level: O2

void __thiscall CFGGrindReader::~CFGGrindReader(CFGGrindReader *this)

{
  (this->super_CFGReader)._vptr_CFGReader = (_func_int **)&PTR__CFGGrindReader_00129aa0;
  InputTokenizer::Lexeme::~Lexeme(&this->m_current);
  InputTokenizer::~InputTokenizer(&this->m_tokens);
  CFGReader::~CFGReader(&this->super_CFGReader);
  return;
}

Assistant:

CFGGrindReader::~CFGGrindReader() {
}